

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

torrent_handle __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
          (session_handle *this,offset_in_session_impl_to_subr f,add_torrent_params *a,
          reference_wrapper<boost::system::error_code> *a_1)

{
  io_context *ctx;
  element_type *peVar1;
  undefined8 uVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  add_torrent_params *in_R8;
  undefined8 *in_R9;
  torrent_handle tVar3;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_3e9;
  exception_ptr local_3e8;
  element_type *local_3e0;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_3d8;
  exception_ptr local_3c8;
  undefined1 local_3c0 [56];
  add_torrent_params local_388;
  undefined8 local_38;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3d8);
  if (local_3d8._M_ptr == (session_impl *)0x0) {
    local_3c0._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_3c0);
  }
  local_3c0._8_8_ = &local_3e9;
  local_3e9 = false;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c0._16_8_ = &local_3e8;
  local_3e8._M_exception_object = (void *)0x0;
  ctx = (local_3d8._M_ptr)->m_io_context;
  local_3e0 = (element_type *)this;
  local_3c0._0_8_ = this;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             (local_3c0 + 0x18),&local_3d8);
  local_3c0._40_8_ = a;
  local_3c0._48_8_ = a_1;
  add_torrent_params::add_torrent_params(&local_388,in_R8);
  local_38 = *in_R9;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>(libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params&&,std::reference_wrapper<boost::system::error_code>&)const::_lambda()_1_>
            (ctx,(type_conflict2 *)local_3c0,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)local_3c0);
  peVar1 = local_3e0;
  aux::torrent_wait(&local_3e9,local_3d8._M_ptr);
  if (local_3e8._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_3e8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d8._M_refcount);
    tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    return (torrent_handle)
           tVar3.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_3c8,&local_3e8);
  uVar2 = ::std::rethrow_exception((exception_ptr)&local_3c8);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_3c8);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_3e8);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_3e0->super_torrent_hot_members);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d8._M_refcount);
  _Unwind_Resume(uVar2);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}